

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bit_vector.cpp
# Opt level: O3

bool __thiscall spvtools::utils::BitVector::Or(BitVector *this,BitVector *other)

{
  ulong *puVar1;
  ulong *puVar2;
  bool bVar3;
  ulong *puVar4;
  ulong *puVar5;
  ulong uVar6;
  
  puVar1 = (this->bits_).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
           super__Vector_impl_data._M_start;
  puVar2 = (this->bits_).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
           super__Vector_impl_data._M_finish;
  puVar5 = (other->bits_).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
           super__Vector_impl_data._M_start;
  puVar4 = (other->bits_).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
           super__Vector_impl_data._M_finish;
  if (puVar5 == puVar4 || puVar1 == puVar2) {
    bVar3 = false;
  }
  else {
    bVar3 = false;
    do {
      uVar6 = *puVar5 | *puVar1;
      if (uVar6 != *puVar1) {
        *puVar1 = uVar6;
        puVar4 = (other->bits_).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                 _M_impl.super__Vector_impl_data._M_finish;
        bVar3 = true;
      }
      puVar5 = puVar5 + 1;
    } while ((puVar1 + 1 != puVar2) && (puVar1 = puVar1 + 1, puVar5 != puVar4));
  }
  if (puVar5 != puVar4) {
    std::vector<unsigned_long,std::allocator<unsigned_long>>::
    _M_range_insert<__gnu_cxx::__normal_iterator<unsigned_long_const*,std::vector<unsigned_long,std::allocator<unsigned_long>>>>
              ();
    bVar3 = true;
  }
  return bVar3;
}

Assistant:

bool BitVector::Or(const BitVector& other) {
  auto this_it = this->bits_.begin();
  auto other_it = other.bits_.begin();
  bool modified = false;

  while (this_it != this->bits_.end() && other_it != other.bits_.end()) {
    auto temp = *this_it | *other_it;
    if (temp != *this_it) {
      modified = true;
      *this_it = temp;
    }
    ++this_it;
    ++other_it;
  }

  if (other_it != other.bits_.end()) {
    modified = true;
    this->bits_.insert(this->bits_.end(), other_it, other.bits_.end());
  }

  return modified;
}